

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O3

T_INDEX __thiscall
Nova::Grid<float,_2>::Clamp_To_Cell(Grid<float,_2> *this,TV *X,int number_of_ghost_cells)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TV *value;
  int in_ECX;
  uint uVar4;
  undefined4 in_register_00000014;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  value = &this->counts;
  uVar1 = *(undefined8 *)X[1]._data._M_elems;
  uVar2 = *(undefined8 *)X[4]._data._M_elems;
  uVar3 = *(undefined8 *)(X->_data)._M_elems;
  uVar4 = 1 - in_ECX;
  uVar5 = (int)((float)uVar2 *
               ((float)*(undefined8 *)CONCAT44(in_register_00000014,number_of_ghost_cells) -
               (float)uVar1)) + 1;
  uVar6 = (int)((float)((ulong)uVar2 >> 0x20) *
               ((float)((ulong)*(undefined8 *)CONCAT44(in_register_00000014,number_of_ghost_cells)
                       >> 0x20) - (float)((ulong)uVar1 >> 0x20))) + 1;
  uVar7 = in_ECX + (int)uVar3;
  uVar8 = in_ECX + (int)((ulong)uVar3 >> 0x20);
  uVar9 = -(uint)((int)uVar4 < (int)uVar5);
  uVar10 = -(uint)((int)uVar4 < (int)uVar6);
  uVar9 = ~uVar9 & uVar4 | uVar5 & uVar9;
  uVar6 = ~uVar10 & uVar4 | uVar6 & uVar10;
  uVar4 = -(uint)((int)uVar7 < (int)uVar9);
  uVar5 = -(uint)((int)uVar8 < (int)uVar6);
  (this->counts)._data._M_elems[0] = ~uVar4 & uVar9 | uVar7 & uVar4;
  (this->counts)._data._M_elems[1] = ~uVar5 & uVar6 | uVar8 & uVar5;
  return (T_INDEX)value;
}

Assistant:

T_INDEX Clamp_To_Cell(const TV& X,const int number_of_ghost_cells=0) const
    {
        T_INDEX index=T_INDEX((X-domain.min_corner)*one_over_dX)+1;
        return Cell_Indices(number_of_ghost_cells).Clamp(index);
    }